

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_uint.h
# Opt level: O0

bool __thiscall
jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>::SetHex
          (base_uint<160UL,_jbcoin::detail::AccountIDTag> *this,char *psz,bool bStrict)

{
  int iVar1;
  size_t sVar2;
  iterator pvVar3;
  byte *pbVar4;
  uchar *puVar5;
  int local_74;
  int cLow;
  int cHigh;
  uchar *pOut;
  uchar *pBegin;
  uchar *pEnd;
  uchar *puStack_20;
  bool bStrict_local;
  char *psz_local;
  base_uint<160UL,_jbcoin::detail::AccountIDTag> *this_local;
  
  puStack_20 = (uchar *)psz;
  if (!bStrict) {
    while (iVar1 = isspace((int)(char)*puStack_20), iVar1 != 0) {
      puStack_20 = puStack_20 + 1;
    }
  }
  if (((!bStrict) && (*puStack_20 == '0')) &&
     (iVar1 = tolower((int)(char)puStack_20[1]), iVar1 == 0x78)) {
    puStack_20 = puStack_20 + 2;
  }
  pBegin = puStack_20;
  pOut = puStack_20;
  while (iVar1 = charUnHex(*pBegin), iVar1 != -1) {
    pBegin = pBegin + 1;
  }
  sVar2 = size();
  if (sVar2 * 2 < (ulong)(uint)((int)pBegin - (int)puStack_20)) {
    sVar2 = size();
    pOut = pBegin + sVar2 * -2;
  }
  pvVar3 = end(this);
  pbVar4 = pvVar3 + -((long)(pBegin + (1 - (long)pOut)) / 2);
  operator=(this);
  _cHigh = pbVar4;
  if (((long)pBegin - (long)pOut & 1U) != 0) {
    iVar1 = charUnHex(*pOut);
    _cHigh = pbVar4 + 1;
    *pbVar4 = (byte)iVar1;
    pOut = pOut + 1;
  }
  while( true ) {
    if (pOut == pBegin) {
      return *pBegin == '\0';
    }
    puVar5 = pOut + 1;
    iVar1 = charUnHex(*pOut);
    if (puVar5 == pBegin) {
      local_74 = 0;
      pOut = puVar5;
    }
    else {
      pOut = pOut + 2;
      local_74 = charUnHex(*puVar5);
    }
    if ((iVar1 == -1) || (local_74 == -1)) break;
    *_cHigh = (byte)(iVar1 << 4) | (byte)local_74;
    _cHigh = _cHigh + 1;
  }
  return false;
}

Assistant:

bool SetHex (const char* psz, bool bStrict = false)
    {
        // skip leading spaces
        if (!bStrict)
            while (isspace (*psz))
                psz++;

        // skip 0x
        if (!bStrict && psz[0] == '0' && tolower (psz[1]) == 'x')
            psz += 2;

        const unsigned char* pEnd   = reinterpret_cast<const unsigned char*> (psz);
        const unsigned char* pBegin = pEnd;

        // Find end.
        while (charUnHex(*pEnd) != -1)
            pEnd++;

        // Take only last digits of over long string.
        if ((unsigned int) (pEnd - pBegin) > 2 * size ())
            pBegin = pEnd - 2 * size ();

        unsigned char* pOut = end () - ((pEnd - pBegin + 1) / 2);

        *this = beast::zero;

        if ((pEnd - pBegin) & 1)
            *pOut++ = charUnHex(*pBegin++);

        while (pBegin != pEnd)
        {
            auto cHigh = charUnHex(*pBegin++);
            auto cLow  = pBegin == pEnd
                            ? 0
                            : charUnHex(*pBegin++);

            if (cHigh == -1 || cLow == -1)
                return false;

            *pOut++ = (cHigh << 4) | cLow;
        }

        return !*pEnd;
    }